

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O2

bool __thiscall Kumu::MemIOReader::ReadUi16BE(MemIOReader *this,ui16_t *i)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  if (i != (ui16_t *)0x0) {
    uVar2 = this->m_capacity;
    uVar3 = this->m_size;
    uVar1 = (ulong)uVar3 + 2;
    if (uVar1 <= uVar2) {
      *i = *(ushort *)(this->m_p + uVar3) << 8 | *(ushort *)(this->m_p + uVar3) >> 8;
      this->m_size = uVar3 + 2;
    }
    return uVar1 <= uVar2;
  }
  __assert_fail("i",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_memio.h"
                ,0xba,"bool Kumu::MemIOReader::ReadUi16BE(ui16_t *)");
}

Assistant:

inline bool ReadUi16BE(ui16_t* i) {
	assert(i);
	if ( ( m_size + sizeof(ui16_t) ) > m_capacity )
	  return false;

	*i = KM_i16_BE(cp2i<ui16_t>(m_p + m_size));
	m_size += sizeof(ui16_t);
	return true;
      }